

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptCompoundStatement(HlslGrammar *this,TIntermNode **retStatement)

{
  TIntermNode *right;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *statements;
  TIntermNode *statement;
  TIntermNode *local_38;
  long lVar3;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (!bVar1) {
    return false;
  }
  local_38 = (TIntermNode *)0x0;
  bVar1 = acceptStatement(this,&local_38);
  statements = (TIntermAggregate *)0x0;
  if (bVar1) {
    do {
      right = local_38;
      if (local_38 == (TIntermNode *)0x0) {
        lVar3 = 0;
      }
      else {
        iVar2 = (*local_38->_vptr_TIntermNode[0xd])(local_38);
        lVar3 = CONCAT44(extraout_var,iVar2);
      }
      if ((lVar3 == 0) || (1 < *(int *)(lVar3 + 0x20) - 0x16dU)) {
        statements = TIntermediate::growAggregate
                               (this->intermediate,(TIntermNode *)statements,right);
      }
      else {
        HlslParseContext::wrapupSwitchSubsequence(this->parseContext,statements,right);
        statements = (TIntermAggregate *)0x0;
      }
      bVar1 = acceptStatement(this,&local_38);
    } while (bVar1);
  }
  if (statements != (TIntermAggregate *)0x0) {
    (*(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(statements,(ulong)(this->intermediate->debugInfo + 1));
  }
  *retStatement = (TIntermNode *)statements;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptCompoundStatement(TIntermNode*& retStatement)
{
    TIntermAggregate* compoundStatement = nullptr;

    // LEFT_CURLY
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // statement statement ...
    TIntermNode* statement = nullptr;
    while (acceptStatement(statement)) {
        TIntermBranch* branch = statement ? statement->getAsBranchNode() : nullptr;
        if (branch != nullptr && (branch->getFlowOp() == EOpCase ||
                                  branch->getFlowOp() == EOpDefault)) {
            // hook up individual subsequences within a switch statement
            parseContext.wrapupSwitchSubsequence(compoundStatement, statement);
            compoundStatement = nullptr;
        } else {
            // hook it up to the growing compound statement
            compoundStatement = intermediate.growAggregate(compoundStatement, statement);
        }
    }
    if (compoundStatement)
        compoundStatement->setOperator(intermediate.getDebugInfo() ? EOpScope : EOpSequence);

    retStatement = compoundStatement;

    // RIGHT_CURLY
    return acceptTokenClass(EHTokRightBrace);
}